

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

void __thiscall Assimp::BVHLoader::~BVHLoader(BVHLoader *this)

{
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_007324b8;
  std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::~vector
            (&this->mNodes);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->mBuffer).super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&this->mFileName);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

BVHLoader::~BVHLoader()
{}